

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O2

REF_STATUS ref_node_tet_vol(REF_NODE ref_node,REF_INT *nodes,REF_DBL *volume)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  REF_GLOB *pRVar6;
  REF_DBL *pRVar7;
  double dVar8;
  double dVar9;
  ulong uVar10;
  ulong uVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  
  iVar1 = *nodes;
  if (((-1 < (long)iVar1) && (iVar2 = ref_node->max, iVar1 < iVar2)) &&
     (pRVar6 = ref_node->global, -1 < pRVar6[iVar1])) {
    uVar3 = nodes[1];
    if (((int)uVar3 < iVar2 && -1 < (int)uVar3) && (-1 < pRVar6[uVar3])) {
      uVar4 = nodes[2];
      if (((int)uVar4 < iVar2 && -1 < (int)uVar4) && (-1 < pRVar6[uVar4])) {
        uVar5 = nodes[3];
        if (((int)uVar5 < iVar2 && -1 < (int)uVar5) && (-1 < pRVar6[uVar5])) {
          pRVar7 = ref_node->real;
          uVar10 = (ulong)(uint)(iVar1 * 0xf);
          uVar11 = (ulong)(uVar5 * 0xf);
          dVar12 = pRVar7[(ulong)(uVar3 * 0xf) + 2] - pRVar7[uVar11 + 2];
          dVar8 = pRVar7[uVar11];
          dVar9 = (pRVar7 + uVar11)[1];
          dVar15 = pRVar7[(ulong)(uVar4 * 0xf) + 1] - pRVar7[uVar11 + 1];
          dVar16 = (pRVar7 + (ulong)(uVar4 * 0xf) + 1)[1] - (pRVar7 + uVar11 + 1)[1];
          dVar13 = pRVar7[uVar3 * 0xf] - dVar8;
          dVar14 = (pRVar7 + uVar3 * 0xf)[1] - dVar9;
          *volume = (((dVar14 * dVar16 - dVar12 * dVar15) * (pRVar7[uVar10] - dVar8) -
                     (dVar16 * dVar13 + -(pRVar7[uVar4 * 0xf] - dVar8) * dVar12) *
                     (pRVar7[uVar10 + 1] - dVar9)) +
                    (dVar13 * dVar15 - dVar14 * (pRVar7[uVar4 * 0xf] - dVar8)) *
                    (pRVar7[uVar10 + 2] - pRVar7[uVar11 + 2])) / -6.0;
          return 0;
        }
      }
    }
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0x9d8,
         "ref_node_tet_vol",3,"node invalid");
  return 3;
}

Assistant:

REF_FCN REF_STATUS ref_node_tet_vol(REF_NODE ref_node, REF_INT *nodes,
                                    REF_DBL *volume) {
  REF_DBL *a, *b, *c, *d;
  REF_DBL m11, m12, m13;
  REF_DBL det;

  if (!ref_node_valid(ref_node, nodes[0]) ||
      !ref_node_valid(ref_node, nodes[1]) ||
      !ref_node_valid(ref_node, nodes[2]) ||
      !ref_node_valid(ref_node, nodes[3]))
    RSS(REF_INVALID, "node invalid");

  a = ref_node_xyz_ptr(ref_node, nodes[0]);
  b = ref_node_xyz_ptr(ref_node, nodes[1]);
  c = ref_node_xyz_ptr(ref_node, nodes[2]);
  d = ref_node_xyz_ptr(ref_node, nodes[3]);

  m11 = (a[0] - d[0]) *
        ((b[1] - d[1]) * (c[2] - d[2]) - (c[1] - d[1]) * (b[2] - d[2]));
  m12 = (a[1] - d[1]) *
        ((b[0] - d[0]) * (c[2] - d[2]) - (c[0] - d[0]) * (b[2] - d[2]));
  m13 = (a[2] - d[2]) *
        ((b[0] - d[0]) * (c[1] - d[1]) - (c[0] - d[0]) * (b[1] - d[1]));
  det = (m11 - m12 + m13);

  *volume = -det / 6.0;

  return REF_SUCCESS;
}